

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::MultisampleShadeCountRenderCase::verifyImage
          (MultisampleShadeCountRenderCase *this,Surface *resultImage)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  RenderTarget RVar3;
  int iVar4;
  TestLog *pTVar5;
  uint uVar6;
  RenderTarget *pRVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  ConstPixelBufferAccess *access;
  _Base_ptr p_Var10;
  void *__buf;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  int y;
  int iVar13;
  void *data;
  int x;
  int iVar14;
  int iVar15;
  bool bVar16;
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  shadeFrequency;
  deUint32 packed;
  string local_2e0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  local_2c0;
  TextureFormat local_290;
  string local_288;
  ConstPixelBufferAccess local_268;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  RVar3 = (this->super_MultisampleRenderCase).m_renderTarget;
  iVar14 = 2;
  if (((RVar3 == TARGET_DEFAULT) || ((this->super_MultisampleRenderCase).m_numRequestedSamples != 0)
      ) && ((RVar3 != TARGET_DEFAULT ||
            (pRVar7 = Context::getRenderTarget
                                ((this->super_MultisampleRenderCase).super_TestCase.m_context),
            1 < pRVar7->m_numSamples)))) {
    iVar14 = (this->super_MultisampleRenderCase).m_numTargetSamples + 1;
  }
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c0._M_impl.super__Rb_tree_header._M_header;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar5 = ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"ResultImage","");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Result Image","");
  local_290.order = RGBA;
  local_290.type = UNORM_INT8;
  data = (void *)(resultImage->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (resultImage->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_268,&local_290,resultImage->m_width,resultImage->m_height,1,data);
  access = &local_268;
  tcu::LogImage::LogImage(&local_240,&local_2e0,&local_288,access,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_240,(int)pTVar5,__buf,(size_t)access);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Verifying image has (at least) ",0x1f);
  std::ostream::operator<<(poVar2,iVar14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," different shades.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,
             "Excluding pixels with no full coverage (pixels on the shared edge of the triangle pair)."
             ,0x58);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
    operator_delete(local_240.m_description._M_dataplus._M_p,
                    local_240.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
    operator_delete(local_240.m_name._M_dataplus._M_p,
                    local_240.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  iVar13 = 0;
  do {
    iVar15 = 0;
    do {
      uVar6 = *(uint *)((long)(resultImage->m_pixels).m_ptr +
                       (long)(resultImage->m_width * iVar13 + iVar15) * 4);
      uVar6 = (uVar6 & 0xff00) << 8 | uVar6 & 0xffff;
      local_1b0._0_4_ = uVar6;
      if (iVar15 != iVar13) {
        p_Var10 = &local_2c0._M_impl.super__Rb_tree_header._M_header;
        for (p_Var11 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
            p_Var11 = (&p_Var11->_M_left)[bVar16]) {
          bVar16 = (uint)*(size_t *)(p_Var11 + 1) < uVar6;
          if (!bVar16) {
            p_Var10 = p_Var11;
          }
        }
        p_Var1 = &local_2c0._M_impl.super__Rb_tree_header;
        p_Var12 = p_Var1;
        if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
           (p_Var12 = (_Rb_tree_header *)p_Var10,
           uVar6 < (uint)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
          p_Var12 = p_Var1;
        }
        if (p_Var12 == p_Var1) {
          pmVar8 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)&local_2c0,(key_type_conflict *)local_1b0);
          *pmVar8 = 1;
        }
        else {
          pmVar8 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)&local_2c0,(key_type_conflict *)local_1b0);
          iVar4 = *pmVar8;
          pmVar8 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)&local_2c0,(key_type_conflict *)local_1b0);
          *pmVar8 = iVar4 + 1;
        }
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0x80);
    iVar13 = iVar13 + 1;
  } while (iVar13 != 0x80);
  iVar13 = 0;
  for (p_Var9 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &local_2c0._M_impl.super__Rb_tree_header;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    iVar13 = iVar13 + (uint)(*(int *)&p_Var9[1].field_0x4 < 100);
  }
  local_1b0._0_8_ =
       ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
       ->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Found ",6);
  std::ostream::operator<<(poVar2,(int)local_2c0._M_impl.super__Rb_tree_header._M_node_count);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," different shades.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\tRare (less than ",0x11);
  std::ostream::operator<<(poVar2,100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," pixels): ",10);
  std::ostream::operator<<(poVar2,iVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\tCommon: ",9);
  std::ostream::operator<<
            (poVar2,(int)local_2c0._M_impl.super__Rb_tree_header._M_node_count - iVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  iVar13 = (int)local_2c0._M_impl.super__Rb_tree_header._M_node_count;
  if ((int)local_2c0._M_impl.super__Rb_tree_header._M_node_count < iVar14) {
    local_1b0._0_8_ =
         ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
         )->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Image verification failed.",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree(&local_2c0);
  return iVar14 <= iVar13;
}

Assistant:

bool MultisampleShadeCountRenderCase::verifyImage (const tcu::Surface& resultImage)
{
	const bool				isSingleSampleTarget	= (m_renderTarget != TARGET_DEFAULT && m_numRequestedSamples == 0) || (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() <= 1);
	const int				numShadesRequired		= (isSingleSampleTarget) ? (2) : (m_numTargetSamples + 1);
	const int				rareThreshold			= 100;
	int						rareCount				= 0;
	std::map<deUint32, int>	shadeFrequency;

	m_testCtx.getLog()
		<< tcu::TestLog::Image("ResultImage", "Result Image", resultImage.getAccess())
		<< tcu::TestLog::Message
		<< "Verifying image has (at least) " << numShadesRequired << " different shades.\n"
		<< "Excluding pixels with no full coverage (pixels on the shared edge of the triangle pair)."
		<< tcu::TestLog::EndMessage;

	for (int y = 0; y < RENDER_SIZE; ++y)
	for (int x = 0; x < RENDER_SIZE; ++x)
	{
		const tcu::RGBA	color	= resultImage.getPixel(x, y);
		const deUint32	packed	= ((deUint32)color.getRed()) + ((deUint32)color.getGreen() << 8) + ((deUint32)color.getGreen() << 16);

		// on the triangle edge, skip
		if (x == y)
			continue;

		if (shadeFrequency.find(packed) == shadeFrequency.end())
			shadeFrequency[packed] = 1;
		else
			shadeFrequency[packed] = shadeFrequency[packed] + 1;
	}

	for (std::map<deUint32, int>::const_iterator it = shadeFrequency.begin(); it != shadeFrequency.end(); ++it)
		if (it->second < rareThreshold)
			rareCount++;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Found " << (int)shadeFrequency.size() << " different shades.\n"
		<< "\tRare (less than " << rareThreshold << " pixels): " << rareCount << "\n"
		<< "\tCommon: " << (int)shadeFrequency.size() - rareCount << "\n"
		<< tcu::TestLog::EndMessage;

	if ((int)shadeFrequency.size() < numShadesRequired)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}